

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void add_range_closed_at(roaring64_bitmap_t *r,art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  ulong uVar1;
  art_val_t *paVar2;
  container_t *pcVar3;
  container_t *pcVar4;
  leaf_t val;
  uint8_t type;
  uint8_t typecode2;
  uint8_t typecode;
  uint8_t local_3a;
  uint8_t local_39;
  roaring64_bitmap_t *local_38;
  
  paVar2 = art_find(art,high48);
  if (paVar2 == (art_val_t *)0x0) {
    pcVar4 = container_range_of_ones((uint)min,max + 1,&local_39);
    val = add_container(r,pcVar4,local_39);
    art_insert(art,high48,val);
  }
  else {
    pcVar4 = r->containers[*paVar2 >> 8];
    type = (uint8_t)*paVar2;
    local_38 = r;
    pcVar3 = container_add_range(pcVar4,type,(uint)min,(uint)max,&local_3a);
    if (pcVar3 != pcVar4) {
      container_free(pcVar4,type);
      uVar1 = *paVar2;
      local_38->containers[uVar1 >> 8] = pcVar3;
      *paVar2 = CONCAT71((int7)(uVar1 >> 8),local_3a);
    }
  }
  return;
}

Assistant:

static inline void add_range_closed_at(roaring64_bitmap_t *r, art_t *art,
                                       uint8_t *high48, uint16_t min,
                                       uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf != NULL) {
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add_range(container1, typecode1, min, max, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
        return;
    }
    uint8_t typecode;
    // container_add_range is inclusive, but `container_range_of_ones` is
    // exclusive.
    container_t *container = container_range_of_ones(min, max + 1, &typecode);
    leaf_t new_leaf = add_container(r, container, typecode);
    art_insert(art, high48, (art_val_t)new_leaf);
}